

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O2

LY_ERR lyplg_type_xpath10_print_token
                 (char *token,uint16_t tok_len,ly_bool is_nametest,lys_module **context_mod,
                 ly_ctx *resolve_ctx,LY_VALUE_FORMAT resolve_format,void *resolve_prefix_data,
                 LY_VALUE_FORMAT get_format,void *get_prefix_data,char **token_p,ly_err_item **err)

{
  LY_ERR LVar1;
  int iVar2;
  uint uVar3;
  lys_module *mod;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  undefined7 in_register_00000011;
  undefined6 in_register_00000032;
  uint uVar6;
  char *__ptr;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  ly_bool is_prefix;
  uint32_t len;
  int local_64;
  lys_module **local_60;
  LY_VALUE_FORMAT local_54;
  ly_ctx *local_50;
  ulong local_48;
  char *local_40;
  char *str_next;
  
  local_40 = token + (CONCAT62(in_register_00000032,tok_len) & 0xffffffff);
  local_64 = (int)CONCAT71(in_register_00000011,is_nametest);
  bVar8 = local_64 == 0;
  bVar9 = false;
  uVar7 = 0;
  __ptr = (char *)0x0;
  local_60 = context_mod;
  local_54 = resolve_format;
  local_50 = resolve_ctx;
  do {
    uVar3 = (uint)uVar7;
    LVar1 = ly_value_prefix_next(token,local_40,&len,&is_prefix,&str_next);
    if ((LVar1 != LY_SUCCESS) || (len == 0)) goto LAB_001b36d4;
    if (is_prefix == '\0') {
      if (((bVar9 || get_format != LY_VALUE_XML) || (char)local_64 == '\0') ||
         (*local_60 == (lys_module *)0x0)) {
        pcVar5 = (char *)realloc(__ptr,(ulong)(uVar3 + len + 1));
        if (pcVar5 == (char *)0x0) {
LAB_001b3683:
          LVar1 = ly_err_new(err,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"No memory.");
          goto LAB_001b36d4;
        }
        iVar2 = sprintf(pcVar5 + uVar7,"%.*s",(ulong)len,token);
      }
      else {
        __s = lyplg_type_get_prefix(*local_60,LY_VALUE_XML,get_prefix_data);
        if (__s == (char *)0x0) {
          uVar3 = 0x3c;
LAB_001b3756:
          __assert_fail("prefix",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                        ,uVar3,
                        "LY_ERR lyplg_type_xpath10_print_token(const char *, uint16_t, ly_bool, const struct lys_module **, const struct ly_ctx *, LY_VALUE_FORMAT, const void *, LY_VALUE_FORMAT, void *, char **, struct ly_err_item **)"
                       );
        }
        sVar4 = strlen(__s);
        pcVar5 = (char *)realloc(__ptr,(ulong)len + sVar4 + uVar7 + 2);
        if (pcVar5 == (char *)0x0) {
          LVar1 = ly_err_new(err,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"No memory.");
          goto LAB_001b36d4;
        }
        bVar9 = false;
        iVar2 = sprintf(pcVar5 + uVar7,"%s:%.*s",__s,(ulong)len,token);
      }
      uVar3 = iVar2 + uVar3;
    }
    else {
      bVar9 = (char)local_64 != '\0';
      local_48 = uVar7;
      mod = lyplg_type_identity_module
                      (local_50,(lysc_node *)0x0,token,(ulong)len,local_54,resolve_prefix_data);
      if (mod == (lys_module *)0x0 && bVar9) {
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Failed to resolve prefix \"%.*s\".",(ulong)len,token);
LAB_001b36d4:
        if (LVar1 == LY_SUCCESS) {
          *token_p = __ptr;
        }
        else {
          free(__ptr);
        }
        return LVar1;
      }
      if (((get_format & ~LY_VALUE_SCHEMA) != LY_VALUE_JSON || bVar8) ||
         (pcVar5 = __ptr, *local_60 != mod)) {
        uVar6 = len;
        if (mod != (lys_module *)0x0) {
          token = lyplg_type_get_prefix(mod,get_format,get_prefix_data);
          if (token == (char *)0x0) {
            uVar3 = 0x5d;
            goto LAB_001b3756;
          }
          sVar4 = strlen(token);
          uVar6 = (uint)sVar4;
        }
        pcVar5 = (char *)realloc(__ptr,(ulong)(uVar6 + uVar3 + 2));
        if (pcVar5 == (char *)0x0) goto LAB_001b3683;
        iVar2 = sprintf(pcVar5 + local_48,"%.*s:",(ulong)uVar6,token);
        uVar3 = iVar2 + uVar3;
        if ((char)local_64 == '\0') {
          bVar9 = true;
          goto LAB_001b3673;
        }
      }
      *local_60 = mod;
      bVar9 = true;
    }
LAB_001b3673:
    uVar7 = (ulong)uVar3;
    token = str_next;
    __ptr = pcVar5;
  } while( true );
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_xpath10_print_token(const char *token, uint16_t tok_len, ly_bool is_nametest, const struct lys_module **context_mod,
        const struct ly_ctx *resolve_ctx, LY_VALUE_FORMAT resolve_format, const void *resolve_prefix_data,
        LY_VALUE_FORMAT get_format, void *get_prefix_data, char **token_p, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *str_begin, *str_next, *prefix;
    ly_bool is_prefix, has_prefix = 0;
    char *str = NULL;
    void *mem;
    uint32_t len, str_len = 0, pref_len;
    const struct lys_module *mod;

    str_begin = token;

    while (!(ret = ly_value_prefix_next(str_begin, token + tok_len, &len, &is_prefix, &str_next)) && len) {
        if (!is_prefix) {
            if (!has_prefix && is_nametest && (get_format == LY_VALUE_XML) && *context_mod) {
                /* get the prefix */
                prefix = lyplg_type_get_prefix(*context_mod, get_format, get_prefix_data);
                assert(prefix);

                /* append the nametest and prefix */
                mem = realloc(str, str_len + strlen(prefix) + 1 + len + 1);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%s:%.*s", prefix, (int)len, str_begin);
            } else {
                /* just append the string, we may get the first expression node without a prefix but since this
                 * is not strictly forbidden, allow it */
                mem = realloc(str, str_len + len + 1);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%.*s", (int)len, str_begin);
            }
        } else {
            /* remember there was a prefix found */
            has_prefix = 1;

            /* resolve the module in the original format */
            mod = lyplg_type_identity_module(resolve_ctx, NULL, str_begin, len, resolve_format, resolve_prefix_data);
            if (!mod && is_nametest) {
                ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Failed to resolve prefix \"%.*s\".",
                        (int)len, str_begin);
                goto cleanup;
            }

            if (is_nametest && ((get_format == LY_VALUE_JSON) || (get_format == LY_VALUE_LYB)) && (*context_mod == mod)) {
                /* inherit the prefix and do not print it again */
            } else {
                if (mod) {
                    /* get the prefix in the target format */
                    prefix = lyplg_type_get_prefix(mod, get_format, get_prefix_data);
                    assert(prefix);
                    pref_len = strlen(prefix);
                } else {
                    /* invalid prefix, just copy it */
                    prefix = str_begin;
                    pref_len = len;
                }

                /* append the prefix */
                mem = realloc(str, str_len + pref_len + 2);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%.*s:", (int)pref_len, prefix);
            }

            if (is_nametest) {
                /* update context module */
                *context_mod = mod;
            }
        }

        str_begin = str_next;
    }

cleanup:
    if (ret) {
        free(str);
    } else {
        *token_p = str;
    }
    return ret;
}